

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

void htmlNodeDumpFormatOutput
               (xmlOutputBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,char *encoding,int format)

{
  int iVar1;
  xmlChar *str;
  xmlChar *buffer;
  htmlElemDesc *info;
  xmlAttrPtr attr;
  xmlNodePtr root;
  int format_local;
  char *encoding_local;
  xmlNodePtr cur_local;
  xmlDocPtr doc_local;
  xmlOutputBufferPtr buf_local;
  
  xmlInitParser();
  if ((cur == (xmlNodePtr)0x0) || (encoding_local = (char *)cur, buf == (xmlOutputBufferPtr)0x0)) {
    return;
  }
LAB_00167cfc:
  switch(*(undefined4 *)(encoding_local + 8)) {
  case 1:
    if (*(long *)(encoding_local + 0x48) == 0) {
      buffer = (xmlChar *)htmlTagLookup(*(xmlChar **)(encoding_local + 0x10));
    }
    else {
      buffer = (xmlChar *)0x0;
    }
    xmlOutputBufferWriteString(buf,"<");
    if ((*(long *)(encoding_local + 0x48) != 0) &&
       (*(long *)(*(long *)(encoding_local + 0x48) + 0x18) != 0)) {
      xmlOutputBufferWriteString(buf,*(char **)(*(long *)(encoding_local + 0x48) + 0x18));
      xmlOutputBufferWriteString(buf,":");
    }
    xmlOutputBufferWriteString(buf,*(char **)(encoding_local + 0x10));
    if (*(long *)(encoding_local + 0x60) != 0) {
      xmlNsListDumpOutput(buf,*(xmlNsPtr *)(encoding_local + 0x60));
    }
    for (info = *(htmlElemDesc **)(encoding_local + 0x58); info != (htmlElemDesc *)0x0;
        info = (htmlElemDesc *)info->attrs_depr) {
      htmlAttrDumpOutput(buf,doc,(xmlAttrPtr)info,encoding);
    }
    if ((buffer == (xmlChar *)0x0) || (buffer[0xb] == '\0')) {
      if (*(long *)(encoding_local + 0x18) != 0) {
        xmlOutputBufferWriteString(buf,">");
        if (((((format != 0) && (buffer != (xmlChar *)0x0)) && (buffer[0xe] == '\0')) &&
            ((*(int *)(*(long *)(encoding_local + 0x18) + 8) != 3 &&
             (*(int *)(*(long *)(encoding_local + 0x18) + 8) != 5)))) &&
           ((*(long *)(encoding_local + 0x18) != *(long *)(encoding_local + 0x20) &&
            ((*(long *)(encoding_local + 0x10) != 0 && (**(char **)(encoding_local + 0x10) != 'p')))
            ))) {
          xmlOutputBufferWriteString(buf,"\n");
        }
        encoding_local = *(char **)(encoding_local + 0x18);
        goto LAB_00167cfc;
      }
      if ((((buffer == (xmlChar *)0x0) || (buffer[10] == '\0')) ||
          (iVar1 = xmlStrcmp(*(xmlChar **)buffer,"html"), iVar1 == 0)) ||
         (iVar1 = xmlStrcmp(*(xmlChar **)buffer,"body"), iVar1 == 0)) {
        xmlOutputBufferWriteString(buf,"></");
        if ((*(long *)(encoding_local + 0x48) != 0) &&
           (*(long *)(*(long *)(encoding_local + 0x48) + 0x18) != 0)) {
          xmlOutputBufferWriteString(buf,*(char **)(*(long *)(encoding_local + 0x48) + 0x18));
          xmlOutputBufferWriteString(buf,":");
        }
        xmlOutputBufferWriteString(buf,*(char **)(encoding_local + 0x10));
        xmlOutputBufferWriteString(buf,">");
      }
      else {
        xmlOutputBufferWriteString(buf,">");
      }
    }
    else {
      xmlOutputBufferWriteString(buf,">");
    }
    if (((((format != 0) && (*(long *)(encoding_local + 0x30) != 0)) &&
         ((buffer != (xmlChar *)0x0 &&
          (((buffer[0xe] == '\0' && (*(int *)(*(long *)(encoding_local + 0x30) + 8) != 3)) &&
           (*(int *)(*(long *)(encoding_local + 0x30) + 8) != 5)))))) &&
        ((*(long *)(encoding_local + 0x28) != 0 &&
         (*(long *)(*(long *)(encoding_local + 0x28) + 0x10) != 0)))) &&
       (**(char **)(*(long *)(encoding_local + 0x28) + 0x10) != 'p')) {
      xmlOutputBufferWriteString(buf,"\n");
    }
    break;
  case 2:
    htmlAttrDumpOutput(buf,doc,(xmlAttrPtr)encoding_local,encoding);
    break;
  case 3:
    if (*(long *)(encoding_local + 0x50) != 0) {
      if (((*(xmlChar **)(encoding_local + 0x10) == "text") ||
          (*(xmlChar **)(encoding_local + 0x10) != "textnoenc")) &&
         ((*(long *)(encoding_local + 0x28) == 0 ||
          ((iVar1 = xmlStrcasecmp(*(xmlChar **)(*(long *)(encoding_local + 0x28) + 0x10),"script"),
           iVar1 != 0 &&
           (iVar1 = xmlStrcasecmp(*(xmlChar **)(*(long *)(encoding_local + 0x28) + 0x10),"style"),
           iVar1 != 0)))))) {
        str = xmlEncodeEntitiesReentrant(doc,*(xmlChar **)(encoding_local + 0x50));
        if (str != (xmlChar *)0x0) {
          xmlOutputBufferWriteString(buf,(char *)str);
          (*xmlFree)(str);
        }
      }
      else {
        xmlOutputBufferWriteString(buf,*(char **)(encoding_local + 0x50));
      }
    }
    break;
  case 4:
    if (*(long *)(encoding_local + 0x50) != 0) {
      xmlOutputBufferWriteString(buf,*(char **)(encoding_local + 0x50));
    }
    break;
  case 5:
    xmlOutputBufferWriteString(buf,"&");
    xmlOutputBufferWriteString(buf,*(char **)(encoding_local + 0x10));
    xmlOutputBufferWriteString(buf,";");
    break;
  default:
    break;
  case 7:
    if (*(long *)(encoding_local + 0x10) != 0) {
      xmlOutputBufferWriteString(buf,"<?");
      xmlOutputBufferWriteString(buf,*(char **)(encoding_local + 0x10));
      if (*(long *)(encoding_local + 0x50) != 0) {
        xmlOutputBufferWriteString(buf," ");
        xmlOutputBufferWriteString(buf,*(char **)(encoding_local + 0x50));
      }
      xmlOutputBufferWriteString(buf,">");
    }
    break;
  case 8:
    if (*(long *)(encoding_local + 0x50) != 0) {
      xmlOutputBufferWriteString(buf,"<!--");
      xmlOutputBufferWriteString(buf,*(char **)(encoding_local + 0x50));
      xmlOutputBufferWriteString(buf,"-->");
    }
    break;
  case 9:
  case 0xd:
    if (*(long *)(encoding_local + 0x50) != 0) {
      htmlDtdDumpOutput(buf,(xmlDocPtr)encoding_local,(char *)0x0);
    }
    if (*(long *)(encoding_local + 0x18) == 0) break;
    encoding_local = *(char **)(encoding_local + 0x18);
    goto LAB_00167cfc;
  }
  while( true ) {
    if ((xmlNodePtr)encoding_local == cur) {
      return;
    }
    if (*(long *)(encoding_local + 0x30) != 0) break;
    if (*(long *)(encoding_local + 0x28) == 0) {
      return;
    }
    encoding_local = *(char **)(encoding_local + 0x28);
    if ((*(int *)(encoding_local + 8) == 0xd) || (*(int *)(encoding_local + 8) == 9)) {
      xmlOutputBufferWriteString(buf,"\n");
    }
    else {
      if ((format == 0) || (*(long *)(encoding_local + 0x48) != 0)) {
        buffer = (xmlChar *)0x0;
      }
      else {
        buffer = (xmlChar *)htmlTagLookup(*(xmlChar **)(encoding_local + 0x10));
      }
      if ((((((format != 0) && (buffer != (xmlChar *)0x0)) && (buffer[0xe] == '\0')) &&
           ((*(int *)(*(long *)(encoding_local + 0x20) + 8) != 3 &&
            (*(int *)(*(long *)(encoding_local + 0x20) + 8) != 5)))) &&
          (*(long *)(encoding_local + 0x18) != *(long *)(encoding_local + 0x20))) &&
         ((*(long *)(encoding_local + 0x10) != 0 && (**(char **)(encoding_local + 0x10) != 'p')))) {
        xmlOutputBufferWriteString(buf,"\n");
      }
      xmlOutputBufferWriteString(buf,"</");
      if ((*(long *)(encoding_local + 0x48) != 0) &&
         (*(long *)(*(long *)(encoding_local + 0x48) + 0x18) != 0)) {
        xmlOutputBufferWriteString(buf,*(char **)(*(long *)(encoding_local + 0x48) + 0x18));
        xmlOutputBufferWriteString(buf,":");
      }
      xmlOutputBufferWriteString(buf,*(char **)(encoding_local + 0x10));
      xmlOutputBufferWriteString(buf,">");
      if (((((format != 0) && (buffer != (xmlChar *)0x0)) && (buffer[0xe] == '\0')) &&
          (((*(long *)(encoding_local + 0x30) != 0 &&
            (*(int *)(*(long *)(encoding_local + 0x30) + 8) != 3)) &&
           ((*(int *)(*(long *)(encoding_local + 0x30) + 8) != 5 &&
            ((*(long *)(encoding_local + 0x28) != 0 &&
             (*(long *)(*(long *)(encoding_local + 0x28) + 0x10) != 0)))))))) &&
         (**(char **)(*(long *)(encoding_local + 0x28) + 0x10) != 'p')) {
        xmlOutputBufferWriteString(buf,"\n");
      }
    }
  }
  encoding_local = *(char **)(encoding_local + 0x30);
  goto LAB_00167cfc;
}

Assistant:

void
htmlNodeDumpFormatOutput(xmlOutputBufferPtr buf, xmlDocPtr doc,
	                 xmlNodePtr cur, const char *encoding, int format) {
    xmlNodePtr root;
    xmlAttrPtr attr;
    const htmlElemDesc * info;

    xmlInitParser();

    if ((cur == NULL) || (buf == NULL)) {
	return;
    }

    root = cur;
    while (1) {
        switch (cur->type) {
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_NODE:
            if (((xmlDocPtr) cur)->intSubset != NULL) {
                htmlDtdDumpOutput(buf, (xmlDocPtr) cur, NULL);
            }
            if (cur->children != NULL) {
                cur = cur->children;
                continue;
            }
            break;

        case XML_ELEMENT_NODE:
            /*
             * Get specific HTML info for that node.
             */
            if (cur->ns == NULL)
                info = htmlTagLookup(cur->name);
            else
                info = NULL;

            xmlOutputBufferWriteString(buf, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWriteString(buf, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutput(buf, cur->nsDef);
            attr = cur->properties;
            while (attr != NULL) {
                htmlAttrDumpOutput(buf, doc, attr, encoding);
                attr = attr->next;
            }

            if ((info != NULL) && (info->empty)) {
                xmlOutputBufferWriteString(buf, ">");
            } else if (cur->children == NULL) {
                if ((info != NULL) && (info->saveEndTag != 0) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "html")) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "body"))) {
                    xmlOutputBufferWriteString(buf, ">");
                } else {
                    xmlOutputBufferWriteString(buf, "></");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWriteString(buf, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWriteString(buf, ">");
                }
            } else {
                xmlOutputBufferWriteString(buf, ">");
                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->children->type != HTML_TEXT_NODE) &&
                    (cur->children->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
                cur = cur->children;
                continue;
            }

            if ((format) && (cur->next != NULL) &&
                (info != NULL) && (!info->isinline)) {
                if ((cur->next->type != HTML_TEXT_NODE) &&
                    (cur->next->type != HTML_ENTITY_REF_NODE) &&
                    (cur->parent != NULL) &&
                    (cur->parent->name != NULL) &&
                    (cur->parent->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
            }

            break;

        case XML_ATTRIBUTE_NODE:
            htmlAttrDumpOutput(buf, doc, (xmlAttrPtr) cur, encoding);
            break;

        case HTML_TEXT_NODE:
            if (cur->content == NULL)
                break;
            if (((cur->name == (const xmlChar *)xmlStringText) ||
                 (cur->name != (const xmlChar *)xmlStringTextNoenc)) &&
                ((cur->parent == NULL) ||
                 ((xmlStrcasecmp(cur->parent->name, BAD_CAST "script")) &&
                  (xmlStrcasecmp(cur->parent->name, BAD_CAST "style"))))) {
                xmlChar *buffer;

                buffer = xmlEncodeEntitiesReentrant(doc, cur->content);
                if (buffer != NULL) {
                    xmlOutputBufferWriteString(buf, (const char *)buffer);
                    xmlFree(buffer);
                }
            } else {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        case HTML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWriteString(buf, "-->");
            }
            break;

        case HTML_PI_NODE:
            if (cur->name != NULL) {
                xmlOutputBufferWriteString(buf, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWriteString(buf, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWriteString(buf, ">");
            }
            break;

        case HTML_ENTITY_REF_NODE:
            xmlOutputBufferWriteString(buf, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWriteString(buf, ";");
            break;

        case HTML_PRESERVE_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            /*
             * The parent should never be NULL here but we want to handle
             * corrupted documents gracefully.
             */
            if (cur->parent == NULL)
                return;
            cur = cur->parent;

            if ((cur->type == XML_HTML_DOCUMENT_NODE) ||
                (cur->type == XML_DOCUMENT_NODE)) {
                xmlOutputBufferWriteString(buf, "\n");
            } else {
                if ((format) && (cur->ns == NULL))
                    info = htmlTagLookup(cur->name);
                else
                    info = NULL;

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->last->type != HTML_TEXT_NODE) &&
                    (cur->last->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");

                xmlOutputBufferWriteString(buf, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                    xmlOutputBufferWriteString(buf, ":");
                }
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWriteString(buf, ">");

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->next != NULL)) {
                    if ((cur->next->type != HTML_TEXT_NODE) &&
                        (cur->next->type != HTML_ENTITY_REF_NODE) &&
                        (cur->parent != NULL) &&
                        (cur->parent->name != NULL) &&
                        (cur->parent->name[0] != 'p')) /* p, pre, param */
                        xmlOutputBufferWriteString(buf, "\n");
                }
            }
        }
    }
}